

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesNH54
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  bool bVar8;
  ulong uVar9;
  uint uVar10;
  ushort uVar11;
  uint uVar12;
  undefined4 uVar13;
  int iVar14;
  ulong *puVar15;
  ulong *puVar16;
  ulong uVar17;
  long lVar18;
  ulong *puVar19;
  ulong *puVar20;
  ulong *puVar21;
  ulong *puVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  ulong *puVar27;
  ulong *puVar28;
  ulong *puVar29;
  ulong *puVar30;
  ulong *puVar31;
  ulong *puVar32;
  short sVar33;
  int iVar34;
  size_t *psVar35;
  char cVar36;
  ulong *puVar37;
  ulong uVar38;
  ulong *puVar39;
  ulong *puVar40;
  ulong *puVar41;
  bool bVar42;
  long lVar43;
  long lVar44;
  ulong local_120;
  ulong *local_118;
  ulong *local_110;
  ulong local_108;
  ulong local_f8;
  ulong auStack_58 [5];
  
  local_120 = *(ulong *)dist_cache;
  puVar2 = (ulong *)(position + num_bytes);
  puVar15 = (ulong *)((position - 7) + num_bytes);
  if (num_bytes < 8) {
    puVar15 = (ulong *)position;
  }
  lVar26 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar26 = 0x40;
  }
  psVar35 = last_insert_len;
  if ((ulong *)(position + 8) < puVar2) {
    puVar37 = (ulong *)((1L << (literal_context_lut[8] & 0x3f)) + -0x10);
    lVar4 = *(long *)(literal_context_lut + 0x10);
    lVar5 = *(long *)(literal_context_lut + 0x60);
    local_110 = (ulong *)(lVar26 + position);
    sVar6 = (params->dictionary).compound.num_chunks;
    uVar10 = (uint)ringbuffer_mask;
    puVar1 = (ulong *)((long)puVar2 - 7);
    puVar22 = (ulong *)position;
    do {
      puVar27 = (ulong *)((long)puVar2 - (long)puVar22);
      puVar28 = puVar37;
      if (puVar22 < puVar37) {
        puVar28 = puVar22;
      }
      uVar38 = (ulong)puVar22 & ringbuffer_mask;
      puVar19 = (ulong *)(ringbuffer + uVar38);
      bVar23 = ringbuffer[uVar38];
      local_118 = (ulong *)(long)*(int *)(hasher->common).extra;
      local_f8 = 0x7e4;
      if (((ulong *)((long)puVar22 - (long)local_118) < puVar22) &&
         (uVar12 = (uint)(ulong *)((long)puVar22 - (long)local_118) & uVar10,
         bVar23 == ringbuffer[uVar12])) {
        puVar16 = (ulong *)(ringbuffer + uVar12);
        puVar40 = puVar19;
        puVar39 = puVar16;
        puVar29 = psVar35;
        for (puVar31 = puVar27; (ulong *)0x7 < puVar31; puVar31 = puVar31 + -1) {
          uVar17 = *puVar40;
          uVar7 = *puVar39;
          if (uVar17 == uVar7) {
            puVar39 = puVar39 + 1;
          }
          else {
            uVar9 = 0;
            if ((uVar7 ^ uVar17) != 0) {
              for (; ((uVar7 ^ uVar17) >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            puVar29 = (ulong *)((long)puVar39 + ((uVar9 >> 3 & 0x1fffffff) - (long)puVar16));
          }
          if (uVar17 != uVar7) goto LAB_01137a59;
          puVar40 = puVar40 + 1;
        }
        if (puVar31 != (ulong *)0x0) {
          puVar29 = (ulong *)0x0;
          do {
            puVar3 = puVar29;
            if (*(char *)((long)puVar39 + (long)puVar29) != *(char *)((long)puVar40 + (long)puVar29)
               ) break;
            puVar29 = (ulong *)((long)puVar29 + 1);
            puVar3 = puVar31;
          } while (puVar31 != puVar29);
          puVar39 = (ulong *)((long)puVar39 + (long)puVar3);
        }
        puVar29 = (ulong *)((long)puVar39 - (long)puVar16);
LAB_01137a59:
        if ((puVar29 < (ulong *)0x4) || (uVar17 = (long)puVar29 * 0x87 + 0x78f, uVar17 < 0x7e5))
        goto LAB_01137a8c;
        bVar23 = *(byte *)((long)puVar19 + (long)puVar29);
        local_f8 = uVar17;
      }
      else {
LAB_01137a8c:
        local_118 = (ulong *)0x0;
        puVar29 = (ulong *)0x0;
      }
      uVar12 = (uint)((ulong)(*(long *)(ringbuffer + uVar38) * -0x1ca5842ca8642d00) >> 0x2c);
      lVar18 = 0;
      lVar43 = 0;
      lVar44 = 1;
      do {
        auStack_58[lVar18] = lVar43 * 8 + (ulong)uVar12 & 0xfffff;
        auStack_58[lVar18 + 1] = lVar44 * 8 + (ulong)uVar12 & 0xfffff;
        lVar18 = lVar18 + 2;
        lVar43 = lVar43 + 2;
        lVar44 = lVar44 + 2;
      } while (lVar18 != 4);
      puVar31 = (ulong *)(ulong)bVar23;
      lVar43 = 0;
      do {
        uVar12 = *(uint *)(sVar6 + auStack_58[lVar43] * 4);
        puVar40 = (ulong *)(ringbuffer + (uVar10 & uVar12));
        if ((((uint)puVar31 == (uint)*(byte *)((long)puVar29 + (long)puVar40)) &&
            (puVar22 != (ulong *)(ulong)uVar12)) &&
           (puVar30 = (ulong *)((long)puVar22 - (long)(ulong)uVar12), puVar16 = puVar27,
           puVar3 = puVar19, puVar20 = puVar40, puVar39 = puVar22, puVar30 <= puVar28)) {
          for (; (ulong *)0x7 < puVar16; puVar16 = puVar16 + -1) {
            uVar38 = *puVar3;
            uVar17 = *puVar20;
            if (uVar38 == uVar17) {
              puVar20 = puVar20 + 1;
            }
            else {
              uVar7 = 0;
              if ((uVar17 ^ uVar38) != 0) {
                for (; ((uVar17 ^ uVar38) >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              puVar39 = (ulong *)((long)puVar20 + ((uVar7 >> 3 & 0x1fffffff) - (long)puVar40));
            }
            if (uVar38 != uVar17) goto LAB_01137bb1;
            puVar3 = puVar3 + 1;
          }
          puVar39 = puVar20;
          if (puVar16 != (ulong *)0x0) {
            puVar39 = (ulong *)((long)puVar20 + (long)puVar16);
            puVar41 = (ulong *)0x0;
            do {
              if (*(char *)((long)puVar20 + (long)puVar41) !=
                  *(char *)((long)puVar3 + (long)puVar41)) {
                puVar39 = (ulong *)((long)puVar20 + (long)puVar41);
                break;
              }
              puVar41 = (ulong *)((long)puVar41 + 1);
            } while (puVar16 != puVar41);
          }
          puVar39 = (ulong *)((long)puVar39 - (long)puVar40);
LAB_01137bb1:
          if ((ulong *)0x3 < puVar39) {
            iVar14 = 0x1f;
            if ((uint)puVar30 != 0) {
              for (; (uint)puVar30 >> iVar14 == 0; iVar14 = iVar14 + -1) {
              }
            }
            uVar38 = (ulong)(iVar14 * -0x1e + 0x780) + (long)puVar39 * 0x87;
            if (local_f8 < uVar38) {
              puVar31 = (ulong *)(ulong)*(byte *)((long)puVar19 + (long)puVar39);
              puVar29 = puVar39;
              local_118 = puVar30;
              local_f8 = uVar38;
            }
          }
        }
        lVar43 = lVar43 + 1;
      } while (lVar43 != 4);
      *(uint *)(sVar6 + *(long *)((long)auStack_58 + (ulong)((uint)puVar22 & 0x18)) * 4) =
           (uint)puVar22;
      if (local_f8 < 0x7e5) {
        local_120 = local_120 + 1;
        position = (long)puVar22 + 1;
        if (local_110 < position) {
          if ((ulong *)((ulong)(uint)((int)lVar26 * 4) + (long)local_110) < position) {
            puVar28 = (ulong *)((long)puVar22 + 0x11);
            if (puVar1 <= (ulong *)((long)puVar22 + 0x11)) {
              puVar28 = puVar1;
            }
            for (; position < puVar28; position = position + 4) {
              *(uint *)(sVar6 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                                (position & ringbuffer_mask)) *
                                                      -0x1ca5842ca8642d00) >> 0x2c) +
                                        ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
              local_120 = local_120 + 4;
            }
          }
          else {
            puVar28 = (ulong *)((long)puVar22 + 9);
            if (puVar1 <= (ulong *)((long)puVar22 + 9)) {
              puVar28 = puVar1;
            }
            for (; position < puVar28; position = position + 2) {
              *(uint *)(sVar6 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                                (position & ringbuffer_mask)) *
                                                      -0x1ca5842ca8642d00) >> 0x2c) +
                                        ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
              local_120 = local_120 + 2;
            }
          }
        }
      }
      else {
        puVar19 = (ulong *)(long)*(int *)(hasher->common).extra;
        puVar28 = (ulong *)0x4;
        iVar14 = 0;
        do {
          puVar27 = (ulong *)((long)puVar27 + -1);
          puVar40 = (ulong *)((long)puVar29 + -1);
          if (puVar27 <= (ulong *)((long)puVar29 + -1)) {
            puVar40 = puVar27;
          }
          if (4 < *(int *)(literal_context_lut + 4)) {
            puVar40 = (ulong *)0x0;
          }
          puVar39 = (ulong *)((long)puVar22 + 1);
          puVar16 = puVar37;
          if (puVar39 < puVar37) {
            puVar16 = puVar39;
          }
          puVar3 = (ulong *)(ringbuffer + ((ulong)puVar39 & ringbuffer_mask));
          cVar36 = *(char *)((long)puVar40 + (long)puVar3);
          puVar20 = (ulong *)((long)puVar39 - (long)puVar19);
          local_108 = 0x7e4;
          if ((puVar20 < puVar39) &&
             (puVar21 = (ulong *)(ringbuffer + ((uint)puVar20 & uVar10)), puVar20 = puVar27,
             puVar41 = puVar3, puVar30 = puVar21, cVar36 == *(char *)((long)puVar40 + (long)puVar21)
             )) {
            for (; puVar28 = puVar41, (ulong *)0x7 < puVar20; puVar20 = puVar20 + -1) {
              uVar38 = *puVar28;
              uVar17 = *puVar30;
              if (uVar38 == uVar17) {
                puVar30 = puVar30 + 1;
              }
              else {
                uVar7 = 0;
                if ((uVar17 ^ uVar38) != 0) {
                  for (; ((uVar17 ^ uVar38) >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                  }
                }
                puVar31 = (ulong *)((long)puVar30 + ((uVar7 >> 3 & 0x1fffffff) - (long)puVar21));
              }
              if (uVar38 != uVar17) goto LAB_01137d48;
              puVar41 = puVar28 + 1;
            }
            puVar31 = puVar30;
            if (puVar20 != (ulong *)0x0) {
              puVar31 = (ulong *)((long)puVar30 + (long)puVar20);
              puVar41 = (ulong *)0x0;
              do {
                if (*(char *)((long)puVar30 + (long)puVar41) !=
                    *(char *)((long)puVar28 + (long)puVar41)) {
                  puVar31 = (ulong *)((long)puVar30 + (long)puVar41);
                  break;
                }
                puVar41 = (ulong *)((long)puVar41 + 1);
              } while (puVar20 != puVar41);
            }
            puVar31 = (ulong *)((long)puVar31 - (long)puVar21);
LAB_01137d48:
            if ((puVar31 < (ulong *)0x4) || (uVar38 = (long)puVar31 * 0x87 + 0x78f, uVar38 < 0x7e5))
            goto LAB_01137d81;
            cVar36 = *(char *)((long)puVar3 + (long)puVar31);
            puVar40 = puVar31;
            local_110 = puVar19;
            local_108 = uVar38;
          }
          else {
LAB_01137d81:
            local_110 = (ulong *)0x0;
          }
          uVar12 = (uint)((ulong)(*(long *)(ringbuffer + ((ulong)puVar39 & ringbuffer_mask)) *
                                 -0x1ca5842ca8642d00) >> 0x2c);
          lVar18 = 0;
          lVar43 = 0;
          lVar44 = 1;
          do {
            auStack_58[lVar18] = lVar43 * 8 + (ulong)uVar12 & 0xfffff;
            auStack_58[lVar18 + 1] = lVar44 * 8 + (ulong)uVar12 & 0xfffff;
            lVar18 = lVar18 + 2;
            lVar43 = lVar43 + 2;
            lVar44 = lVar44 + 2;
          } while (lVar18 != 4);
          lVar43 = 0;
          do {
            uVar12 = *(uint *)(sVar6 + auStack_58[lVar43] * 4);
            puVar20 = (ulong *)(ringbuffer + (uVar10 & uVar12));
            if (((cVar36 == *(char *)((long)puVar40 + (long)puVar20)) &&
                (puVar39 != (ulong *)(ulong)uVar12)) &&
               (puVar32 = (ulong *)((long)puVar39 - (long)(ulong)uVar12), puVar30 = puVar27,
               puVar21 = puVar3, puVar41 = puVar20, puVar32 <= puVar16)) {
              for (; puVar31 = puVar21, (ulong *)0x7 < puVar30; puVar30 = puVar30 + -1) {
                uVar38 = *puVar31;
                uVar17 = *puVar41;
                if (uVar38 == uVar17) {
                  puVar41 = puVar41 + 1;
                }
                else {
                  uVar7 = 0;
                  if ((uVar17 ^ uVar38) != 0) {
                    for (; ((uVar17 ^ uVar38) >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                    }
                  }
                  puVar28 = (ulong *)((long)puVar41 + ((uVar7 >> 3 & 0x1fffffff) - (long)puVar20));
                }
                if (uVar38 != uVar17) goto LAB_01137ea1;
                puVar21 = puVar31 + 1;
              }
              puVar28 = puVar41;
              if (puVar30 != (ulong *)0x0) {
                puVar28 = (ulong *)((long)puVar30 + (long)puVar41);
                puVar21 = (ulong *)0x0;
                do {
                  if (*(char *)((long)puVar41 + (long)puVar21) !=
                      *(char *)((long)puVar31 + (long)puVar21)) {
                    puVar28 = (ulong *)((long)puVar41 + (long)puVar21);
                    break;
                  }
                  puVar21 = (ulong *)((long)puVar21 + 1);
                } while (puVar30 != puVar21);
              }
              puVar28 = (ulong *)((long)puVar28 - (long)puVar20);
LAB_01137ea1:
              if ((ulong *)0x3 < puVar28) {
                iVar34 = 0x1f;
                if ((uint)puVar32 != 0) {
                  for (; (uint)puVar32 >> iVar34 == 0; iVar34 = iVar34 + -1) {
                  }
                }
                uVar38 = (ulong)(iVar34 * -0x1e + 0x780) + (long)puVar28 * 0x87;
                if (local_108 < uVar38) {
                  cVar36 = *(char *)((long)puVar3 + (long)puVar28);
                  puVar40 = puVar28;
                  local_110 = puVar32;
                  local_108 = uVar38;
                }
              }
            }
            lVar43 = lVar43 + 1;
          } while (lVar43 != 4);
          *(uint *)(sVar6 + *(long *)((long)auStack_58 + (ulong)((uint)puVar39 & 0x18)) * 4) =
               (uint)puVar39;
          bVar42 = local_f8 + 0xaf <= local_108;
          puVar16 = puVar22;
          iVar34 = iVar14;
          if (bVar42) {
            local_120 = local_120 + 1;
            local_f8 = local_108;
            local_118 = local_110;
            puVar29 = puVar40;
            puVar16 = puVar39;
            iVar34 = iVar14 + 1;
          }
          bVar8 = iVar14 < 3;
          puVar40 = (ulong *)((long)puVar22 + 9);
          puVar22 = puVar16;
          iVar14 = iVar34;
        } while (bVar42 && (bVar8 && puVar40 < puVar2));
        puVar22 = (ulong *)(lVar4 + (long)puVar16);
        if (puVar37 <= (ulong *)(lVar4 + (long)puVar16)) {
          puVar22 = puVar37;
        }
        if ((ulong *)((long)puVar22 + lVar5) < local_118) {
LAB_01138127:
          uVar38 = (long)local_118 + 0xf;
        }
        else {
          puVar28 = (ulong *)(long)*(int *)(hasher->common).extra;
          uVar12 = 0;
          bVar42 = false;
          if (local_118 != puVar28) {
            puVar27 = (ulong *)(long)*(int *)((long)(hasher->common).extra + 4);
            if (local_118 == puVar27) {
              uVar12 = 1;
LAB_01137fe8:
              bVar42 = false;
            }
            else {
              uVar38 = (long)local_118 + (3 - (long)puVar28);
              if (uVar38 < 7) {
                iVar14 = (int)uVar38;
                uVar12 = 0x9750468;
              }
              else {
                uVar38 = (long)local_118 + (3 - (long)puVar27);
                if (6 < uVar38) {
                  if (local_118 != (ulong *)(long)*(int *)((hasher->common).extra + 1)) {
                    bVar42 = local_118 !=
                             (ulong *)(long)*(int *)((long)(hasher->common).extra + 0xc);
                    uVar12 = 3;
                    goto LAB_0113811e;
                  }
                  uVar12 = 2;
                  goto LAB_01137fe8;
                }
                iVar14 = (int)uVar38;
                uVar12 = 0xfdb1ace;
              }
              uVar12 = uVar12 >> ((byte)(iVar14 << 2) & 0x1f) & 0xf;
              bVar42 = false;
            }
          }
LAB_0113811e:
          if (bVar42) goto LAB_01138127;
          uVar38 = (ulong)uVar12;
        }
        if ((local_118 <= (ulong *)((long)puVar22 + lVar5)) && (uVar38 != 0)) {
          *(undefined4 *)((long)(hasher->common).extra + 0xc) =
               *(undefined4 *)((hasher->common).extra + 1);
          *(void **)((long)(hasher->common).extra + 4) = (hasher->common).extra[0];
          *(int *)(hasher->common).extra = (int)local_118;
        }
        uVar12 = (uint)local_120;
        *(uint *)psVar35 = uVar12;
        iVar14 = (int)puVar29;
        *(int *)((long)psVar35 + 4) = iVar14;
        uVar17 = (ulong)*(uint *)(literal_context_lut + 0x3c) + 0x10;
        if (uVar38 < uVar17) {
          *(short *)((long)psVar35 + 0xe) = (short)uVar38;
          uVar13 = 0;
        }
        else {
          bVar23 = (byte)*(int *)(literal_context_lut + 0x38);
          uVar38 = ((uVar38 - *(uint *)(literal_context_lut + 0x3c)) + (4L << (bVar23 & 0x3f))) -
                   0x10;
          uVar24 = 0x1f;
          if ((uint)uVar38 != 0) {
            for (; (uint)uVar38 >> uVar24 == 0; uVar24 = uVar24 - 1) {
            }
          }
          uVar24 = (uVar24 ^ 0xffffffe0) + 0x1f;
          bVar42 = (uVar38 >> ((ulong)uVar24 & 0x3f) & 1) != 0;
          iVar34 = uVar24 - *(int *)(literal_context_lut + 0x38);
          *(ushort *)((long)psVar35 + 0xe) =
               (short)((uint)bVar42 + iVar34 * 2 + 0xfffe << (bVar23 & 0x3f)) +
               (short)uVar17 + (~(ushort)(-1 << (bVar23 & 0x1f)) & (ushort)uVar38) |
               (short)iVar34 * 0x400;
          uVar13 = (undefined4)
                   (uVar38 - ((ulong)bVar42 + 2 << ((byte)uVar24 & 0x3f)) >> (bVar23 & 0x3f));
        }
        *(undefined4 *)(psVar35 + 1) = uVar13;
        if (5 < local_120) {
          if (local_120 < 0x82) {
            uVar12 = 0x1f;
            uVar24 = (uint)(local_120 - 2);
            if (uVar24 != 0) {
              for (; uVar24 >> uVar12 == 0; uVar12 = uVar12 - 1) {
              }
            }
            uVar12 = (int)(local_120 - 2 >> ((char)(uVar12 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar12 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_120 < 0x842) {
            uVar24 = 0x1f;
            if (uVar12 - 0x42 != 0) {
              for (; uVar12 - 0x42 >> uVar24 == 0; uVar24 = uVar24 - 1) {
              }
            }
            uVar12 = (uVar24 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar12 = 0x15;
            if (0x1841 < local_120) {
              uVar12 = (uint)(ushort)(0x17 - (local_120 < 0x5842));
            }
          }
        }
        uVar38 = (ulong)iVar14;
        if (uVar38 < 10) {
          uVar24 = iVar14 - 2;
        }
        else if (uVar38 < 0x86) {
          uVar24 = 0x1f;
          uVar25 = (uint)(uVar38 - 6);
          if (uVar25 != 0) {
            for (; uVar25 >> uVar24 == 0; uVar24 = uVar24 - 1) {
            }
          }
          uVar24 = (int)(uVar38 - 6 >> ((char)(uVar24 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar24 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar24 = 0x17;
          if (uVar38 < 0x846) {
            uVar24 = 0x1f;
            if (iVar14 - 0x46U != 0) {
              for (; iVar14 - 0x46U >> uVar24 == 0; uVar24 = uVar24 - 1) {
              }
            }
            uVar24 = (uVar24 ^ 0xffe0) + 0x2c;
          }
        }
        uVar11 = (ushort)uVar24;
        sVar33 = (uVar11 & 7) + ((ushort)uVar12 & 7) * 8;
        if ((((*(ushort *)((long)psVar35 + 0xe) & 0x3ff) == 0) && ((ushort)uVar12 < 8)) &&
           (uVar11 < 0x10)) {
          if (7 < uVar11) {
            sVar33 = sVar33 + 0x40;
          }
        }
        else {
          iVar14 = ((uVar12 & 0xffff) >> 3) * 3 + ((uVar24 & 0xffff) >> 3);
          sVar33 = sVar33 + ((ushort)(0x520d40 >> ((char)iVar14 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar14 * 0x40 + 0x40;
        }
        *(short *)((long)psVar35 + 0xc) = sVar33;
        *num_commands = *num_commands + local_120;
        position = (long)puVar16 + (long)puVar29;
        puVar22 = puVar15;
        if (position < puVar15) {
          puVar22 = (ulong *)position;
        }
        puVar28 = (ulong *)((long)puVar16 + 2);
        if (local_118 < (ulong *)((ulong)puVar29 >> 2)) {
          puVar27 = (ulong *)(position + (long)local_118 * -4);
          if (puVar27 < puVar28) {
            puVar27 = puVar28;
          }
          puVar28 = puVar27;
          if (puVar22 < puVar27) {
            puVar28 = puVar22;
          }
        }
        local_110 = (ulong *)(lVar26 + (long)puVar29 * 2 + (long)puVar16);
        psVar35 = psVar35 + 2;
        if (puVar28 < puVar22) {
          do {
            *(uint *)(sVar6 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                              ((ulong)puVar28 & ringbuffer_mask)) *
                                                    -0x1ca5842ca8642d00) >> 0x2c) +
                                      ((uint)puVar28 & 0x18) & 0xfffff) * 4) = (uint)puVar28;
            puVar28 = (ulong *)((long)puVar28 + 1);
          } while (puVar22 != puVar28);
        }
        local_120 = 0;
      }
      puVar22 = (ulong *)position;
    } while ((ulong *)(position + 8) < puVar2);
  }
  *(ulong *)dist_cache = (long)puVar2 + (local_120 - position);
  *(long *)commands = *(long *)commands + ((long)psVar35 - (long)last_insert_len >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}